

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError UTF16BEToUTF8(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  xmlCharEncError xVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  iVar9 = (int)out;
  iVar6 = (int)in;
  if (0 < (int)((long)*inlen & 0xfffffffffffffffeU)) {
    pbVar10 = in + ((long)*inlen & 0xfffffffffffffffeU);
    pbVar11 = out + *outlen;
    do {
      bVar1 = *in;
      bVar2 = in[1];
      uVar3 = CONCAT11(bVar1,bVar2);
      if (0x7f < uVar3) {
        if (bVar1 < 8) {
          if (1 < (long)pbVar11 - (long)out) {
            *out = (byte)(uVar3 >> 6) | 0xc0;
            out[1] = bVar2 & 0x3f | 0x80;
            lVar5 = 2;
            lVar8 = 2;
            goto LAB_0012ab7d;
          }
        }
        else if ((bVar1 & 0xf8) == 0xd8) {
          xVar4 = XML_ENC_ERR_INPUT;
          if ((bVar1 & 0xdc) != 0xd8) goto LAB_0012abd0;
          if ((long)pbVar10 - (long)in < 4) break;
          if ((in[2] & 0xfc) != 0xdc) goto LAB_0012abd0;
          if (3 < (long)pbVar11 - (long)out) {
            bVar1 = in[3];
            uVar7 = (uint)uVar3 * 0x400 + (uint)CONCAT11(in[2],bVar1) + 0xfca02400;
            *out = (byte)(uVar7 >> 0x12) | 0xf0;
            out[1] = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
            out[2] = (byte)(uVar7 >> 6) & 0x3f | 0x80;
            out[3] = bVar1 & 0x3f | 0x80;
            lVar5 = 4;
            lVar8 = 4;
            goto LAB_0012ab7d;
          }
        }
        else if (2 < (long)pbVar11 - (long)out) {
          *out = bVar1 >> 4 | 0xe0;
          out[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
          out[2] = bVar2 & 0x3f | 0x80;
          lVar8 = 3;
          goto LAB_0012aa8b;
        }
LAB_0012abcb:
        xVar4 = XML_ENC_ERR_SPACE;
        goto LAB_0012abd0;
      }
      if (pbVar11 <= out) goto LAB_0012abcb;
      *out = bVar2;
      lVar8 = 1;
LAB_0012aa8b:
      lVar5 = 2;
LAB_0012ab7d:
      in = in + lVar5;
      out = out + lVar8;
    } while (in < pbVar10);
  }
  xVar4 = (int)out - iVar9;
LAB_0012abd0:
  *outlen = (int)out - iVar9;
  *inlen = (int)in - iVar6;
  return xVar4;
}

Assistant:

static xmlCharEncError
UTF16BEToUTF8(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend = in + (*inlen & ~1);
    unsigned char *outstart = out;
    unsigned char *outend = out + *outlen;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    while (in < inend) {
        c = (in[0] << 8) | in[1];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            in += 2;
            out += 1;
        } else if (c < 0x800) {
            if (outend - out < 2)
                goto done;
            out[0] = (c >> 6)   | 0xC0;
            out[1] = (c & 0x3F) | 0x80;
            in += 2;
            out += 2;
        } else if ((c & 0xF800) != 0xD800) {
            if (outend - out < 3)
                goto done;
            out[0] =  (c >> 12)         | 0xE0;
            out[1] = ((c >>  6) & 0x3F) | 0x80;
            out[2] =  (c        & 0x3F) | 0x80;
            in += 2;
            out += 3;
        } else {
            /* Surrogate pair */
            if ((c & 0xFC00) != 0xD800) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (inend - in < 4)
		break;
            d = (in[2] << 8) | in[3];
            if ((d & 0xFC00) != 0xDC00) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (outend - out < 4)
		goto done;
            c = (c << 10) + d - ((0xD800 << 10) + 0xDC00 - 0x10000);
            out[0] =  (c >> 18)         | 0xF0;
            out[1] = ((c >> 12) & 0x3F) | 0x80;
            out[2] = ((c >>  6) & 0x3F) | 0x80;
            out[3] =  (c        & 0x3F) | 0x80;
            in += 4;
            out += 4;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}